

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O3

void __thiscall
cppcms::impl::cgi::connection::async_write_handler::operator()
          (async_write_handler *this,error_code *ein)

{
  const_buffer *buf;
  pointer peVar1;
  element_type *peVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t n;
  undefined4 extraout_var_00;
  error_code e;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_68;
  error_code local_60;
  const_buffer local_50;
  
  if (ein->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(&this->h,ein);
    return;
  }
  local_60._M_value = 0;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  iVar4 = (*((this->conn).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0xe])();
  booster::aio::basic_io_device::set_non_blocking_if_needed(SUB41(iVar4,0),(error_code *)0x1);
  iVar4 = (*((this->conn).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0xe])();
  buf = &this->output;
  n = booster::aio::stream_socket::write_some
                ((const_buffer *)CONCAT44(extraout_var,iVar4),(error_code *)buf);
  booster::aio::details::advance<booster::aio::const_buffer>(&local_50,buf,n);
  (this->output).super_buffer_impl<const_char_*>.entry_.size =
       local_50.super_buffer_impl<const_char_*>.entry_.size;
  (this->output).super_buffer_impl<const_char_*>.size_ =
       local_50.super_buffer_impl<const_char_*>.size_;
  *(undefined4 *)&(this->output).super_buffer_impl<const_char_*>.field_0x4 =
       local_50.super_buffer_impl<const_char_*>._4_4_;
  (this->output).super_buffer_impl<const_char_*>.entry_.ptr =
       local_50.super_buffer_impl<const_char_*>.entry_.ptr;
  peVar1 = (this->output).super_buffer_impl<const_char_*>.vec_.
           super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->output).super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_50.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->output).super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_50.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->output).super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_50.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (peVar1 != (pointer)0x0) {
    operator_delete(peVar1);
    if (local_50.super_buffer_impl<const_char_*>.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super_buffer_impl<const_char_*>.vec_.
                      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (n != 0) {
    peVar2 = (this->conn).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_connection[8])
              (peVar2,(ulong)((this->output).super_buffer_impl<const_char_*>.size_ == 0));
  }
  if ((buf->super_buffer_impl<const_char_*>).size_ == 0) {
LAB_001c689e:
    booster::callback<void_(const_std::error_code_&)>::operator()(&this->h,&local_60);
  }
  else {
    if (local_60._M_value != 0) {
      cVar3 = booster::aio::basic_io_device::would_block(&local_60);
      if (cVar3 == '\0') goto LAB_001c689e;
    }
    iVar4 = (*((this->conn).
               super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_connection[0xe])();
    local_68.p_ = &this->super_callable<void_(const_std::error_code_&)>;
    booster::atomic_counter::inc();
    local_50.super_buffer_impl<const_char_*>._0_8_ = this;
    booster::atomic_counter::inc();
    booster::aio::basic_io_device::on_writeable((callback *)CONCAT44(extraout_var_00,iVar4));
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_50);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_68);
  }
  return;
}

Assistant:

virtual void operator()(booster::system::error_code const &ein)
	{
		if(ein) { h(ein); return; }
		booster::system::error_code e;
		conn->socket().set_non_blocking_if_needed(true,e);
		size_t n = conn->socket().write_some(output,e);
		output += n;
		if(n!=0) {
			conn->on_async_write_progress(output.empty());
		}
		if(output.empty()) {
			h(e);
			return;
		}
		if(e && !booster::aio::basic_io_device::would_block(e)) {
			h(e);
			return;
		}
		conn->socket().on_writeable(self_type(this));
	}